

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# child-typer.h
# Opt level: O2

void __thiscall
wasm::ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector>::visitRefAs
          (ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector> *this,RefAs *curr)

{
  RefAsOp RVar1;
  Type *this_00;
  HeapType HStack_40;
  Type local_30;
  Type local_28;
  
  RVar1 = curr->op;
  if (RVar1 == ExternConvertAny) {
    this_00 = &local_28;
    HStack_40.id = 0x20;
  }
  else {
    if (RVar1 != AnyConvertExtern) {
      if (RVar1 == RefAsNonNull) {
        IRBuilder::ChildPopper::ConstraintCollector::noteAnyReferenceType
                  ((ConstraintCollector *)this,&curr->value);
        return;
      }
      handle_unreachable("unexpected op",
                         "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/child-typer.h"
                         ,0x40f);
    }
    this_00 = &local_30;
    HStack_40.id = 8;
  }
  wasm::Type::Type(this_00,HStack_40,Nullable,Inexact);
  IRBuilder::ChildPopper::ConstraintCollector::noteSubtype
            ((ConstraintCollector *)this,&curr->value,(Type)this_00->id);
  return;
}

Assistant:

void visitRefAs(RefAs* curr) {
    switch (curr->op) {
      case RefAsNonNull:
        noteAnyReference(&curr->value);
        return;
      case AnyConvertExtern:
        note(&curr->value, Type(HeapType::ext, Nullable));
        return;
      case ExternConvertAny:
        note(&curr->value, Type(HeapType::any, Nullable));
        return;
    }
    WASM_UNREACHABLE("unexpected op");
  }